

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void UA_SecureChannel_removeChunk(UA_SecureChannel *channel,UA_UInt32 requestId)

{
  ChunkEntry *local_20;
  ChunkEntry *ch;
  UA_UInt32 requestId_local;
  UA_SecureChannel *channel_local;
  
  local_20 = (channel->chunks).lh_first;
  while( true ) {
    if (local_20 == (ChunkEntry *)0x0) {
      return;
    }
    if (local_20->requestId == requestId) break;
    local_20 = (local_20->pointers).le_next;
  }
  UA_ByteString_deleteMembers(&local_20->bytes);
  if ((local_20->pointers).le_next != (ChunkEntry *)0x0) {
    (((local_20->pointers).le_next)->pointers).le_prev = (local_20->pointers).le_prev;
  }
  *(local_20->pointers).le_prev = (local_20->pointers).le_next;
  free(local_20);
  return;
}

Assistant:

static void
UA_SecureChannel_removeChunk(UA_SecureChannel *channel, UA_UInt32 requestId) {
    struct ChunkEntry *ch;
    LIST_FOREACH(ch, &channel->chunks, pointers) {
        if(ch->requestId == requestId) {
            UA_ByteString_deleteMembers(&ch->bytes);
            LIST_REMOVE(ch, pointers);
            UA_free(ch);
            return;
        }
    }
}